

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::do_bind(Server *this)

{
  int iVar1;
  sockaddr local_20;
  
  local_20.sa_data[6] = '\0';
  local_20.sa_data[7] = '\0';
  local_20.sa_data[8] = '\0';
  local_20.sa_data[9] = '\0';
  local_20.sa_data[10] = '\0';
  local_20.sa_data[0xb] = '\0';
  local_20.sa_data[0xc] = '\0';
  local_20.sa_data[0xd] = '\0';
  local_20.sa_family = 2;
  local_20.sa_data._0_2_ = this->port_no << 8 | this->port_no >> 8;
  local_20.sa_data._2_4_ = inet_addr((this->server_addr)._M_dataplus._M_p);
  iVar1 = bind(this->server_sock,&local_20,0x10);
  if (-1 < iVar1) {
    return;
  }
  fprintf(_stderr,"%s:%d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",0x3d
         );
  fprintf(_stderr,"--> %s\n",
          "bind(this->server_sock, (struct sockaddr *) &serv_addr, sizeof(serv_addr))");
  perror("info");
  exit(1);
}

Assistant:

void Server::do_bind() {
    struct sockaddr_in serv_addr;
    bzero((char *) &serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    serv_addr.sin_port = htons(this->port_no);
    serv_addr.sin_addr.s_addr = inet_addr(this->server_addr.c_str());
    IF_NEGATIVE_EXIT(bind(this->server_sock, (struct sockaddr *) &serv_addr, sizeof(serv_addr)));
}